

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  Image local_168;
  Image local_108;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Image image;
  
  image._92_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"../img/fist.jpg",&local_91);
  Image::Image((Image *)local_70,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Image::sobel(&local_168,(Image *)local_70);
  Image::GNG(&local_108,&local_168);
  Image::displayImage(&local_108);
  Image::~Image(&local_108);
  Image::~Image(&local_168);
  image._92_4_ = 0;
  Image::~Image((Image *)local_70);
  return image._92_4_;
}

Assistant:

int main() {
    Image image("../img/fist.jpg");

    // Image edges(image.canny().getBinaryMatrix());

    // Image gng = image.canny().GNG();
    // image.sobel().displayImage();
    image.sobel().GNG().displayImage();
    return 0;
}